

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_list_iterator.cpp
# Opt level: O1

int main(void)

{
  List<Employee_*> *pLVar1;
  Employee **ppEVar2;
  Employee *pEVar3;
  PrintNEmployees pa;
  ListTraverser<Employee_*> local_38;
  undefined8 local_18;
  
  pLVar1 = (List<Employee_*> *)operator_new(0x18);
  pLVar1->_size = 200;
  pLVar1->_count = 0;
  ppEVar2 = (Employee **)operator_new__(0x640);
  pLVar1->_items = ppEVar2;
  pEVar3 = (Employee *)operator_new(1);
  *ppEVar2 = pEVar3;
  pLVar1->_count = 1;
  pEVar3 = (Employee *)operator_new(1);
  ppEVar2[1] = pEVar3;
  pLVar1->_count = 2;
  pEVar3 = (Employee *)operator_new(1);
  pLVar1->_items[2] = pEVar3;
  pLVar1->_count = 3;
  local_38._iterator.super_Iterator<Employee_*>._vptr_Iterator = (_func_int **)&PTR_First_00103d48;
  local_38._iterator._current = 0;
  local_38._vptr_ListTraverser = (_func_int **)&PTR_ProcessItem_00103cf0;
  local_18 = 10;
  local_38._iterator._list = pLVar1;
  ListTraverser<Employee_*>::Traverse(&local_38);
  return 0;
}

Assistant:

int main()
{
    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    PrintNEmployees pa(employees, 10);
    pa.Traverse();
}